

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur.cpp
# Opt level: O0

void __thiscall embree::Tutorial::drawGUI(Tutorial *this)

{
  bool bVar1;
  char *in_stack_00000008;
  float in_stack_00000010;
  float in_stack_00000014;
  float *in_stack_00000018;
  char *in_stack_00000020;
  bool *in_stack_00000130;
  char *in_stack_00000138;
  
  bVar1 = ImGui::SliderInt(in_stack_00000020,(int *)in_stack_00000018,(int)in_stack_00000014,
                           (int)in_stack_00000010,in_stack_00000008,this._4_4_);
  if (bVar1) {
    g_reset = true;
  }
  bVar1 = ImGui::SliderInt(in_stack_00000020,(int *)in_stack_00000018,(int)in_stack_00000014,
                           (int)in_stack_00000010,in_stack_00000008,this._4_4_);
  if (bVar1) {
    g_reset = true;
  }
  bVar1 = ImGui::Checkbox(in_stack_00000138,in_stack_00000130);
  if (bVar1) {
    g_reset = true;
  }
  bVar1 = ImGui::Checkbox(in_stack_00000138,in_stack_00000130);
  if (bVar1) {
    g_reset = true;
  }
  if ((g_motion_blur & 1U) == 0) {
    bVar1 = ImGui::SliderFloat(in_stack_00000020,in_stack_00000018,in_stack_00000014,
                               in_stack_00000010,in_stack_00000008,this._4_4_);
    if (bVar1) {
      g_reset = true;
    }
  }
  else {
    bVar1 = ImGui::SliderFloat(in_stack_00000020,in_stack_00000018,in_stack_00000014,
                               in_stack_00000010,in_stack_00000008,this._4_4_);
    if (bVar1) {
      g_reset = true;
    }
  }
  if (g_drawGUI != (DrawGUI)0x0) {
    (*g_drawGUI)();
  }
  return;
}

Assistant:

void drawGUI() override
    {
      if (ImGui::SliderInt ("samples per pixel",  &g_spp, 1, 32))  g_reset = true;
      if (ImGui::SliderInt ("time steps",  &g_numTimeSteps, 3, 10))  g_reset = true;
      if (ImGui::Checkbox ("animate", &g_animate)) g_reset = true;
      if (ImGui::Checkbox ("motion blur", &g_motion_blur)) g_reset = true;
      if (!g_motion_blur) {
        if (ImGui::SliderFloat ("time", &g_time, 0.f, 1.f)) g_reset = true;
      } else {
        if (ImGui::SliderFloat ("shutter close", &g_shutter_close, 0.f, 1.f)) g_reset = true;
      }
      if (g_drawGUI)
        g_drawGUI();
    }